

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O1

void __thiscall
QPDFCryptoProvider::setDefaultProvider_internal(QPDFCryptoProvider *this,string *name)

{
  element_type *peVar1;
  const_iterator cVar2;
  logic_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  peVar1 = (this->m).super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
          ::find(&(peVar1->providers)._M_t,name);
  if (cVar2._M_node != &(peVar1->providers)._M_t._M_impl.super__Rb_tree_header._M_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (this->m).super___shared_ptr<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,
                 "QPDFCryptoProvider: request to set default provider to unknown implementation \"",
                 name);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_60 == plVar4) {
    local_50 = *plVar4;
    lStack_48 = plVar3[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar4;
  }
  local_58 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_60);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDFCryptoProvider::setDefaultProvider_internal(std::string const& name)
{
    if (!m->providers.count(name)) {
        throw std::logic_error(
            "QPDFCryptoProvider: request to set default provider to unknown implementation \"" +
            name + "\"");
    }
    m->default_provider = name;
}